

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

void __thiscall
HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::And
          (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this,
          HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this2)

{
  int iVar1;
  SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar3;
  NodeBase *pNVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type *this_01;
  Type *pTVar7;
  ulong uVar8;
  JITTypeHolder *this_02;
  undefined1 local_60 [8];
  EditingIterator iter;
  undefined1 local_40 [8];
  Iterator iter2;
  
  if (this->tableSize != 0) {
    iter.last = (NodeBase *)this;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar8 = 0;
    do {
      local_40 = (undefined1  [8])(this2->table + uVar8);
      iter2.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   local_40;
      if (local_40 == (undefined1  [8])0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) {
LAB_003f1abf:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
      pSVar2 = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)
               ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      iter2.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   0x0;
      if ((undefined1  [8])pSVar2 != local_40) {
        iter2.list = pSVar2;
      }
      local_60 = (undefined1  [8])(iter.last[2].next + uVar8 * 2);
      iter.super_Iterator.current = (NodeBase *)0x0;
      iter.super_Iterator.list =
           (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)local_60;
LAB_003f185f:
      bVar5 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
              EditingIterator::Next((EditingIterator *)local_60);
      if (bVar5) {
        this_01 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                  Iterator::Data((Iterator *)local_60);
        if ((iter2.list !=
             (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
           ((undefined1  [8])iter2.list != local_40)) {
          while (iVar1 = this_01->value,
                pTVar7 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                         ::Iterator::Data((Iterator *)local_40), iVar1 < pTVar7->value) {
            if (iter2.list ==
                (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0)
            {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                 ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar5) goto LAB_003f1abf;
              *puVar6 = 0;
            }
            pSVar2 = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *
                     )((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            iter2.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                          *)0x0;
            if ((undefined1  [8])pSVar2 != local_40) {
              iter2.list = pSVar2;
            }
            if ((iter2.list ==
                 (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0
                ) || ((undefined1  [8])iter2.list == local_40)) break;
          }
        }
        if ((iter2.list !=
             (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
           (((undefined1  [8])iter2.list != local_40 &&
            (iVar1 = this_01->value,
            pTVar7 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                     Iterator::Data((Iterator *)local_40), iVar1 == pTVar7->value)))) {
          pTVar7 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_40);
          bVar5 = JITTypeHolderBase<void>::operator!=
                            ((JITTypeHolderBase<void> *)this_01,(JITTypeHolderBase<void> *)pTVar7);
          if (!bVar5) {
            this_02 = &(this_01->element).finalType;
            bVar5 = JITTypeHolderBase<void>::operator!=(this_02,&(pTVar7->element).finalType);
            if (!bVar5) {
              iVar1 = this_01->value;
              pTVar7 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                       ::Iterator::Data((Iterator *)local_40);
              if (iVar1 == pTVar7->value) {
                pTVar7 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                         ::Iterator::Data((Iterator *)local_40);
                bVar5 = JITTypeHolderBase<void>::operator==
                                  ((JITTypeHolderBase<void> *)this_01,
                                   (JITTypeHolderBase<void> *)pTVar7);
                if ((!bVar5) ||
                   (bVar5 = JITTypeHolderBase<void>::operator==
                                      (this_02,&(pTVar7->element).finalType), !bVar5))
                goto LAB_003f19ea;
              }
              else {
LAB_003f19ea:
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar6 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/HashTable.h"
                                   ,0x108,
                                   "(bucket.value == iter2.Data().value && bucket.element == iter2.Data().element)"
                                   ,"Huh??");
                if (!bVar5) goto LAB_003f1abf;
                *puVar6 = 0;
              }
              if (iter2.list ==
                  (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)
                  0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar6 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                   ,0x76,"(current != nullptr)","current != nullptr");
                if (!bVar5) goto LAB_003f1abf;
                *puVar6 = 0;
              }
              pSVar2 = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                        *)((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
              iter2.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                            *)0x0;
              if ((undefined1  [8])pSVar2 != local_40) {
                iter2.list = pSVar2;
              }
              goto LAB_003f185f;
            }
          }
        }
        pNVar4 = iter.last;
        pSVar2 = iter.super_Iterator.list;
        this_00 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                  (iter.last)->next;
        SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
        EditingIterator::UnlinkCurrentNode((EditingIterator *)local_60);
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  (this_00,pSVar2,0x30);
        if ((DictionaryStats *)pNVar4[3].next != (DictionaryStats *)0x0) {
          DictionaryStats::Remove((DictionaryStats *)pNVar4[3].next,false);
        }
        goto LAB_003f185f;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < *(uint *)&iter.last[1].next);
  }
  return;
}

Assistant:

void And(HashTable<T> *this2)
    {
        for (uint i = 0; i < this->tableSize; i++)
        {
            _TYPENAME SListBase<Bucket<T>>::Iterator iter2(&this2->table[i]);
            iter2.Next();
            FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, &this->table[i], iter)
            {
                while (iter2.IsValid() && bucket.value < iter2.Data().value)
                {
                    iter2.Next();
                }

                if (!iter2.IsValid() || bucket.value != iter2.Data().value || bucket.element != iter2.Data().element)
                {
                    iter.RemoveCurrent(this->alloc);
#if PROFILE_DICTIONARY
                    if (stats)
                        stats->Remove(false);
#endif
                    continue;
                }
                else
                {
                    AssertMsg(bucket.value == iter2.Data().value && bucket.element == iter2.Data().element, "Huh??");
                }
                iter2.Next();
            } NEXT_SLISTBASE_ENTRY_EDITING;
        }
    }